

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool trans_VMOV_single(DisasContext_conflict1 *s,arg_VMOV_single *a)

{
  uint uVar1;
  int reg;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *s_00;
  _Bool _Var2;
  uintptr_t o_1;
  TCGTemp *pTVar3;
  TCGv_i32 pTVar4;
  uint uVar5;
  uintptr_t o;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  uVar1 = s->isar->mvfr0;
  if ((uVar1 & 0xf0) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    _Var2 = full_vfp_access_check(s,false);
    if (_Var2) {
      if (a->l == 0) {
        reg = a->rt;
        s_00 = s->uc->tcg_ctx;
        pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
        pTVar4 = (TCGv_i32)((long)pTVar3 - (long)s_00);
        load_reg_var(s,pTVar4,reg);
        uVar5 = a->vn << 2;
        pTVar3 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
        tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i32,(TCGArg)pTVar3,
                            (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                            (ulong)(uVar5 & 4) +
                            ((ulong)(uVar5 & 8) | (ulong)((uint)a->vn >> 2) << 8) + 0xc10);
      }
      else {
        pTVar3 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
        uVar5 = a->vn << 2;
        tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar3,
                            (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                            (ulong)(uVar5 & 4) +
                            ((ulong)(uVar5 & 8) | (ulong)((uint)a->vn >> 2) << 8) + 0xc10);
        if (a->rt != 0xf) {
          store_reg(s,a->rt,(TCGv_i32)((long)pTVar3 - (long)tcg_ctx));
          goto LAB_0065e758;
        }
        pTVar4 = tcg_const_i32_aarch64(tcg_ctx,-0x10000000);
        local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pTVar3 = (TCGTemp *)((TCGv_i32)((long)pTVar3 - (long)tcg_ctx) + (long)tcg_ctx);
        local_40 = pTVar3;
        local_38 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
        tcg_gen_callN_aarch64(tcg_ctx,helper_cpsr_write_aarch64,(TCGTemp *)0x0,3,&local_48);
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
      }
      tcg_temp_free_internal_aarch64(tcg_ctx,pTVar3);
    }
  }
LAB_0065e758:
  return (uVar1 & 0xf0) != 0;
}

Assistant:

static bool trans_VMOV_single(DisasContext *s, arg_VMOV_single *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (a->l) {
        /* VFP to general purpose register */
        tmp = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg32(tcg_ctx, tmp, a->vn);
        if (a->rt == 15) {
            /* Set the 4 flag bits in the CPSR.  */
            gen_set_nzcv(tmp);
            tcg_temp_free_i32(tcg_ctx, tmp);
        } else {
            store_reg(s, a->rt, tmp);
        }
    } else {
        /* general purpose register to VFP */
        tmp = load_reg(s, a->rt);
        neon_store_reg32(tcg_ctx, tmp, a->vn);
        tcg_temp_free_i32(tcg_ctx, tmp);
    }

    return true;
}